

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void __thiscall
diy::ReduceProxy::ReduceProxy
          (ReduceProxy *this,Proxy *proxy,void *block,uint round,Assigner *assigner,
          GIDVector *incoming_gids,GIDVector *outgoing_gids)

{
  pointer piVar1;
  uint uVar2;
  value_type local_50;
  Link *local_48;
  Link *local_40;
  ReduceProxy *local_38;
  
  Master::Proxy::Proxy(&this->super_Proxy,proxy);
  this->block_ = block;
  this->round_ = round;
  this->assigner_ = assigner;
  local_40 = &this->in_link_;
  (this->in_link_).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001cf5c0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = &this->out_link_;
  (this->out_link_).super_Factory<diy::Link>._vptr_Factory =
       (_func_int **)&PTR_id_abi_cxx11__001cf5c0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->out_link_).neighbors_.super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  local_38 = this;
  while( true ) {
    piVar1 = (incoming_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(incoming_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= (ulong)uVar2) break;
    local_50.gid = piVar1[uVar2];
    local_50.proc = (*assigner->_vptr_Assigner[3])(assigner);
    Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
              (&(this->in_link_).neighbors_,&local_50);
    uVar2 = uVar2 + 1;
  }
  uVar2 = 0;
  while( true ) {
    piVar1 = (outgoing_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(outgoing_gids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= (ulong)uVar2) break;
    local_50.gid = piVar1[uVar2];
    local_50.proc = (*assigner->_vptr_Assigner[3])(assigner);
    Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
              (&(this->out_link_).neighbors_,&local_50);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

ReduceProxy(Master::Proxy&&         proxy, //!< parent proxy
                void*                   block, //!< diy block
                unsigned                round, //!< current round
                const Assigner&         assigner, //!< assigner
                const GIDVector&        incoming_gids, //!< incoming gids in this group
                const GIDVector&        outgoing_gids): //!< outgoing gids in this group
      Master::Proxy(std::move(proxy)),
      block_(block),
      round_(round),
      assigner_(assigner)
    {
      // setup in_link
      for (unsigned i = 0; i < incoming_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = incoming_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        in_link_.add_neighbor(nbr);
      }

      // setup out_link
      for (unsigned i = 0; i < outgoing_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = outgoing_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        out_link_.add_neighbor(nbr);
      }
    }